

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O1

NeuralNetwork *
addInnerProductLayer
          (Model *m,bool isUpdatable,char *name,TensorAttributes *inTensorAttr,
          TensorAttributes *outTensorAttr,bool areWeightsQuantized,bool isBiasQuantized)

{
  int iVar1;
  ConvolutionLayerParams *pCVar2;
  long lVar3;
  Rep *pRVar4;
  long lVar5;
  NeuralNetwork *pNVar6;
  Type *this;
  InnerProductLayerParams *this_00;
  WeightParams *pWVar7;
  QuantizationParams *pQVar8;
  LinearQuantizationParams *pLVar9;
  string local_50;
  
  if (m->_oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(m);
    m->_oneof_case_[0] = 500;
    pNVar6 = (NeuralNetwork *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(pNVar6);
    (m->Type_).neuralnetwork_ = pNVar6;
  }
  pNVar6 = (NeuralNetwork *)(m->Type_).pipeline_;
  this = google::protobuf::internal::RepeatedPtrFieldBase::
         Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                   (&(pNVar6->layers_).super_RepeatedPtrFieldBase,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::set_name(this,name);
  CoreML::Specification::NeuralNetworkLayer::add_input(this,inTensorAttr->name);
  CoreML::Specification::NeuralNetworkLayer::add_output(this,outTensorAttr->name);
  if (this->_oneof_case_[0] != 0x8c) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this);
    this->_oneof_case_[0] = 0x8c;
    this_00 = (InnerProductLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(this_00);
    (this->layer_).innerproduct_ = this_00;
  }
  pCVar2 = (this->layer_).convolution_;
  *(undefined8 *)&pCVar2->_kernelsize_cached_byte_size_ = 1;
  (pCVar2->stride_).current_size_ = 1;
  (pCVar2->stride_).total_size_ = 0;
  lVar3._0_4_ = (pCVar2->kernelsize_).current_size_;
  lVar3._4_4_ = (pCVar2->kernelsize_).total_size_;
  if (lVar3 == 0) {
    pWVar7 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar7);
    *(WeightParams **)&pCVar2->kernelsize_ = pWVar7;
  }
  lVar3 = *(long *)&pCVar2->kernelsize_;
  if (areWeightsQuantized) {
    if (*(long *)(lVar3 + 0x40) == 0) {
      pQVar8 = (QuantizationParams *)operator_new(0x28);
      CoreML::Specification::QuantizationParams::QuantizationParams(pQVar8);
      *(QuantizationParams **)(lVar3 + 0x40) = pQVar8;
    }
    pQVar8 = *(QuantizationParams **)(lVar3 + 0x40);
    pQVar8->numberofbits_ = 1;
    if (pQVar8->_oneof_case_[0] != 0x65) {
      CoreML::Specification::QuantizationParams::clear_QuantizationType(pQVar8);
      pQVar8->_oneof_case_[0] = 0x65;
      pLVar9 = (LinearQuantizationParams *)operator_new(0x40);
      CoreML::Specification::LinearQuantizationParams::LinearQuantizationParams(pLVar9);
      (pQVar8->QuantizationType_).linearquantization_ = pLVar9;
    }
    pLVar9 = (pQVar8->QuantizationType_).linearquantization_;
    iVar1 = (pLVar9->scale_).total_size_;
    if ((pLVar9->scale_).current_size_ == iVar1) {
      google::protobuf::RepeatedField<float>::Reserve(&pLVar9->scale_,iVar1 + 1);
    }
    iVar1 = (pLVar9->scale_).current_size_;
    (pLVar9->scale_).current_size_ = iVar1 + 1;
    ((pLVar9->scale_).rep_)->elements[iVar1] = 1.0;
    iVar1 = (pLVar9->bias_).total_size_;
    if ((pLVar9->bias_).current_size_ == iVar1) {
      google::protobuf::RepeatedField<float>::Reserve(&pLVar9->bias_,iVar1 + 1);
    }
    iVar1 = (pLVar9->bias_).current_size_;
    (pLVar9->bias_).current_size_ = iVar1 + 1;
    ((pLVar9->bias_).rep_)->elements[iVar1] = 0.0;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"x01","");
    google::protobuf::internal::ArenaStringPtr::SetNoArena
              ((ArenaStringPtr *)(lVar3 + 0x38),
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               &local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (*(int *)(lVar3 + 0x10) == *(int *)(lVar3 + 0x14)) {
      google::protobuf::RepeatedField<float>::Reserve
                ((RepeatedField<float> *)(lVar3 + 0x10),*(int *)(lVar3 + 0x14) + 1);
    }
    iVar1 = *(int *)(lVar3 + 0x10);
    *(int *)(lVar3 + 0x10) = iVar1 + 1;
    *(undefined4 *)(*(long *)(lVar3 + 0x18) + 8 + (long)iVar1 * 4) = 0x3f800000;
  }
  *(undefined1 *)&(pCVar2->stride_).rep_ = 1;
  if ((pCVar2->kernelsize_).rep_ == (Rep *)0x0) {
    pWVar7 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar7);
    (pCVar2->kernelsize_).rep_ = (Rep *)pWVar7;
  }
  pRVar4 = (pCVar2->kernelsize_).rep_;
  if (isBiasQuantized) {
    if (pRVar4[4].arena == (Arena *)0x0) {
      pQVar8 = (QuantizationParams *)operator_new(0x28);
      CoreML::Specification::QuantizationParams::QuantizationParams(pQVar8);
      pRVar4[4].arena = (Arena *)pQVar8;
    }
    pQVar8 = (QuantizationParams *)pRVar4[4].arena;
    pQVar8->numberofbits_ = 1;
    if (pQVar8->_oneof_case_[0] != 0x65) {
      CoreML::Specification::QuantizationParams::clear_QuantizationType(pQVar8);
      pQVar8->_oneof_case_[0] = 0x65;
      pLVar9 = (LinearQuantizationParams *)operator_new(0x40);
      CoreML::Specification::LinearQuantizationParams::LinearQuantizationParams(pLVar9);
      (pQVar8->QuantizationType_).linearquantization_ = pLVar9;
    }
    pLVar9 = (pQVar8->QuantizationType_).linearquantization_;
    iVar1 = (pLVar9->scale_).total_size_;
    if ((pLVar9->scale_).current_size_ == iVar1) {
      google::protobuf::RepeatedField<float>::Reserve(&pLVar9->scale_,iVar1 + 1);
    }
    iVar1 = (pLVar9->scale_).current_size_;
    (pLVar9->scale_).current_size_ = iVar1 + 1;
    ((pLVar9->scale_).rep_)->elements[iVar1] = 1.0;
    iVar1 = (pLVar9->bias_).total_size_;
    if ((pLVar9->bias_).current_size_ == iVar1) {
      google::protobuf::RepeatedField<float>::Reserve(&pLVar9->bias_,iVar1 + 1);
    }
    iVar1 = (pLVar9->bias_).current_size_;
    (pLVar9->bias_).current_size_ = iVar1 + 1;
    ((pLVar9->bias_).rep_)->elements[iVar1] = 0.0;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"x01","");
    google::protobuf::internal::ArenaStringPtr::SetNoArena
              ((ArenaStringPtr *)pRVar4[3].elements,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               &local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    iVar1 = *(int *)((long)&pRVar4[1].arena + 4);
    if (*(int *)&pRVar4[1].arena == iVar1) {
      google::protobuf::RepeatedField<float>::Reserve
                ((RepeatedField<float> *)(pRVar4 + 1),iVar1 + 1);
    }
    iVar1 = *(int *)&pRVar4[1].arena;
    *(int *)&pRVar4[1].arena = iVar1 + 1;
    *(undefined4 *)(pRVar4[1].elements[0] + 8 + (long)iVar1 * 4) = 0x3f800000;
  }
  if (isUpdatable) {
    this->isupdatable_ = true;
    lVar5._0_4_ = (pCVar2->kernelsize_).current_size_;
    lVar5._4_4_ = (pCVar2->kernelsize_).total_size_;
    if (lVar5 == 0) {
      pWVar7 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar7);
      *(WeightParams **)&pCVar2->kernelsize_ = pWVar7;
    }
    *(undefined1 *)(*(long *)&pCVar2->kernelsize_ + 0x48) = 1;
    if ((pCVar2->kernelsize_).rep_ == (Rep *)0x0) {
      pWVar7 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar7);
      (pCVar2->kernelsize_).rep_ = (Rep *)pWVar7;
    }
    *(undefined1 *)(pCVar2->kernelsize_).rep_[4].elements = 1;
  }
  return pNVar6;
}

Assistant:

Specification::NeuralNetwork* addInnerProductLayer(Specification::Model& m, bool isUpdatable, const char *name, const TensorAttributes *inTensorAttr, const TensorAttributes *outTensorAttr, bool areWeightsQuantized, bool isBiasQuantized) {
    
    auto neuralNet = m.mutable_neuralnetwork();
    auto layer = neuralNet->add_layers();
    
    layer->set_name(name);
    layer->add_input(inTensorAttr->name);
    layer->add_output(outTensorAttr->name);
    Specification::InnerProductLayerParams *innerProductParams = layer->mutable_innerproduct();
    innerProductParams->set_inputchannels(1);
    innerProductParams->set_outputchannels(1);

    // set weight
    auto* weights = innerProductParams->mutable_weights();
    if (areWeightsQuantized) {
        auto *quant_params = weights->mutable_quantization();
        quant_params->set_numberofbits(1);
        auto *linear_quant_params = quant_params->mutable_linearquantization();
        linear_quant_params->add_scale(1.0f);
        linear_quant_params->add_bias(0.0f);
        weights->set_int8rawvalue("x01"); // this is [1]
    } else {
        weights->add_floatvalue(1.0);
    }

    // set bias
    innerProductParams->set_hasbias(true);
    auto* bias = innerProductParams->mutable_bias();
    if (isBiasQuantized) {
        auto *quant_params = bias->mutable_quantization();
        quant_params->set_numberofbits(1);
        auto *linear_quant_params = quant_params->mutable_linearquantization();
        linear_quant_params->add_scale(1.0f);
        linear_quant_params->add_bias(0.0f);
        bias->set_int8rawvalue("x01"); // this is [1]
    } else {
        bias->add_floatvalue(1.0);
    }
    
    if (isUpdatable) {
        layer->set_isupdatable(true);
        innerProductParams->mutable_weights()->set_isupdatable(true);
        innerProductParams->mutable_bias()->set_isupdatable(true);
    }

    return neuralNet;
}